

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::
     NbQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
     ::lf_heterogeneous_queue_lifetime_tests(void)

{
  bool bVar1;
  runtime_type<> *prVar2;
  int *piVar3;
  allocator_type *paVar4;
  LfHeterQueue<runtime_type<>,_move_only_void_allocator> *const_move_only_queue;
  allocator_type allocator_copy;
  LfHeterQueue<runtime_type<>,_move_only_void_allocator> move_only_queue;
  move_only_void_allocator movable_alloc;
  consume_operation cons;
  type other_queue;
  LfHeterQueue<> queue;
  default_allocator allocator;
  int local_28c [3];
  lf_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_280;
  move_only_void_allocator local_1f1;
  consume_operation local_1f0;
  consume_operation local_1d8;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_1c0;
  int local_118 [5];
  int local_104;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_100;
  basic_default_allocator<65536UL> local_51 [73];
  
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_100,local_51);
  local_104 = 1;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::push<int>(&local_100,&local_104);
  local_118[0] = 2;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::push<int>(&local_100,local_118);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_1c0,&local_100);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_100);
  if ((!bVar1) ||
     (bVar1 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::empty(&local_1c0), bVar1)) {
    detail::assert_failed<>
              ("queue.empty() && !other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
               ,0x31);
  }
  density::swap(&local_100,&local_1c0);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_100);
  if ((bVar1) ||
     (bVar1 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::empty(&local_1c0), !bVar1)) {
    detail::assert_failed<>
              ("!queue.empty() && other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
               ,0x35);
  }
  density::swap(&local_100,&local_1c0);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_100);
  if ((!bVar1) ||
     (bVar1 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::empty(&local_1c0), bVar1)) {
    detail::assert_failed<>
              ("queue.empty() && !other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
               ,0x37);
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::try_start_consume(&local_1d8,&local_1c0);
  bVar1 = density::lf_heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)&local_1d8);
  if (bVar1) {
    prVar2 = density::
             lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::consume_operation::complete_type(&local_1d8);
    bVar1 = density::runtime_type<>::is<int>(prVar2);
    if ((!bVar1) ||
       (piVar3 = density::
                 lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                 ::consume_operation::element<int>(&local_1d8), *piVar3 != 1)) goto LAB_029fae78;
  }
  else {
LAB_029fae78:
    detail::assert_failed<>
              ("cons && cons.complete_type().template is<int>() && cons.template element<int>() == 1"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
               ,0x3b);
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit(&local_1d8);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::try_start_consume(&local_1f0,&local_1c0);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::operator=(&local_1d8,&local_1f0);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::~consume_operation(&local_1f0);
  bVar1 = density::lf_heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)&local_1d8);
  if (bVar1) {
    prVar2 = density::
             lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::consume_operation::complete_type(&local_1d8);
    bVar1 = density::runtime_type<>::is<int>(prVar2);
    if ((bVar1) &&
       (piVar3 = density::
                 lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                 ::consume_operation::element<int>(&local_1d8), *piVar3 == 2)) goto LAB_029faf51;
  }
  detail::assert_failed<>
            ("cons && cons.complete_type().template is<int>() && cons.template element<int>() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
             ,0x40);
LAB_029faf51:
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit(&local_1d8);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_1c0);
  if (!bVar1) {
    detail::assert_failed<>
              ("other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
               ,0x42);
  }
  move_only_void_allocator::move_only_void_allocator(&local_1f1,5);
  density::
  lf_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_280,&local_1f1);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::get_allocator(&local_1c0);
  local_28c[1] = 1;
  density::
  lf_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::push<int>(&local_280,local_28c + 1);
  local_28c[0] = 2;
  density::
  lf_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::push<int>(&local_280,local_28c);
  paVar4 = density::
           lf_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::get_allocator_ref(&local_280);
  move_only_void_allocator::dummy_func(paVar4);
  paVar4 = density::
           lf_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::get_allocator_ref(&local_280);
  move_only_void_allocator::const_dummy_func(paVar4);
  density::
  lf_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_280);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::~consume_operation(&local_1d8);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_1c0);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_100);
  return;
}

Assistant:

static void lf_heterogeneous_queue_lifetime_tests()
        {
            using namespace density;

            {
                default_allocator allocator;
                LfHeterQueue<>    queue(allocator); // copy construct allocator
                queue.push(1);
                queue.push(2);

                auto other_queue(
                  std::move(queue)); // move construct queue - the source becomes empty
                DENSITY_TEST_ASSERT(queue.empty() && !other_queue.empty());

                // test swaps
                swap(queue, other_queue);
                DENSITY_TEST_ASSERT(!queue.empty() && other_queue.empty());
                swap(queue, other_queue);
                DENSITY_TEST_ASSERT(queue.empty() && !other_queue.empty());
                auto cons = other_queue.try_start_consume();
                DENSITY_TEST_ASSERT(
                  cons && cons.complete_type().template is<int>() &&
                  cons.template element<int>() == 1);
                cons.commit();
                cons = other_queue.try_start_consume();
                DENSITY_TEST_ASSERT(
                  cons && cons.complete_type().template is<int>() &&
                  cons.template element<int>() == 2);
                cons.commit();
                DENSITY_TEST_ASSERT(other_queue.empty());

                // test allocator getters
                move_only_void_allocator                               movable_alloc(5);
                LfHeterQueue<runtime_type<>, move_only_void_allocator> move_only_queue(
                  std::move(movable_alloc));

                auto allocator_copy = other_queue.get_allocator();
                (void)allocator_copy;

                move_only_queue.push(1);
                move_only_queue.push(2);

                move_only_queue.get_allocator_ref().dummy_func();

                auto const & const_move_only_queue(move_only_queue);
                const_move_only_queue.get_allocator_ref().const_dummy_func();
            }
        }